

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::getCubeLinearSamples
               (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,float u,float v,
               int depth,Vec4 (*dst) [4])

{
  int i_00;
  int j;
  int size_00;
  deInt32 x_;
  deInt32 y_;
  ulong uVar1;
  CubeFaceIntCoords CVar2;
  Vector<float,_4> *local_120;
  int local_118;
  undefined8 uStack_114;
  int i_3;
  undefined8 local_10c;
  int local_104;
  undefined8 uStack_100;
  int i_2;
  undefined8 local_f8;
  int local_f0;
  int local_ec;
  int i_1;
  int bothOutOfBoundsNdx;
  undefined8 local_e0;
  CubeFaceIntCoords local_d8;
  CubeFaceCoords<int> local_c8;
  undefined8 local_bc;
  CubeFaceIntCoords coords;
  int i;
  bool hasBothCoordsOutOfBounds [4];
  Vec4 sampleColors [4];
  IVec2 baseSampleCoords [4];
  int y1;
  int y0;
  int x1;
  int x0;
  int size;
  Vec4 (*dst_local) [4];
  int depth_local;
  float v_local;
  float u_local;
  CubeFace baseFace_local;
  ConstPixelBufferAccess (*faceAccesses_local) [6];
  
  size_00 = ConstPixelBufferAccess::getWidth(*faceAccesses);
  x_ = deFloorFloatToInt32(u - 0.5);
  y_ = deFloorFloatToInt32(v - 0.5);
  Vector<int,_2>::Vector((Vector<int,_2> *)(sampleColors[3].m_data + 2),x_,y_);
  Vector<int,_2>::Vector(baseSampleCoords,x_ + 1,y_);
  Vector<int,_2>::Vector(baseSampleCoords + 1,x_,y_ + 1);
  Vector<int,_2>::Vector(baseSampleCoords + 2,x_ + 1,y_ + 1);
  local_120 = (Vector<float,_4> *)&i;
  do {
    Vector<float,_4>::Vector(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != (Vector<float,_4> *)(sampleColors[3].m_data + 2));
  for (coords.s = 0; coords.s < 4; coords.s = coords.s + 1) {
    CubeFaceCoords<int>::CubeFaceCoords(&local_c8,baseFace,baseSampleCoords + (long)coords.s + -1);
    CVar2 = remapCubeEdgeCoords(&local_c8,size_00);
    local_d8._0_8_ = CVar2._0_8_;
    local_bc._0_4_ = local_d8.face;
    local_bc._4_4_ = local_d8.s;
    uVar1 = local_bc;
    local_d8.t = CVar2.t;
    coords.face = local_d8.t;
    local_bc._0_4_ = CVar2.face;
    *(bool *)((long)&coords.t + (long)coords.s) = (CubeFace)local_bc == CUBEFACE_LAST;
    local_bc = uVar1;
    if ((*(byte *)((long)&coords.t + (long)coords.s) & 1) == 0) {
      uVar1 = local_d8._0_8_ & 0xffffffff;
      local_bc._4_4_ = CVar2.s;
      i_00 = local_bc._4_4_;
      j = local_d8.t;
      local_d8 = CVar2;
      lookup((tcu *)&i_1,*faceAccesses + uVar1,i_00,j,depth);
      *(undefined8 *)(hasBothCoordsOutOfBounds + (long)coords.s * 0x10 + -4) = _i_1;
      *(undefined8 *)sampleColors[coords.s].m_data = local_e0;
      CVar2 = local_d8;
    }
    local_d8 = CVar2;
  }
  local_ec = -1;
  for (local_f0 = 0; local_f0 < 4; local_f0 = local_f0 + 1) {
    if ((*(byte *)((long)&coords.t + (long)local_f0) & 1) != 0) {
      local_ec = local_f0;
    }
  }
  if (local_ec != -1) {
    Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff00,0.0);
    *(undefined8 *)(hasBothCoordsOutOfBounds + (long)local_ec * 0x10 + -4) = uStack_100;
    *(undefined8 *)sampleColors[local_ec].m_data = local_f8;
    for (local_104 = 0; local_104 < 4; local_104 = local_104 + 1) {
      if (local_104 != local_ec) {
        Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)(hasBothCoordsOutOfBounds + (long)local_ec * 0x10 + -4),
                   (Vector<float,_4> *)(hasBothCoordsOutOfBounds + (long)local_104 * 0x10 + -4));
      }
    }
    operator*((tcu *)&stack0xfffffffffffffeec,
              (Vector<float,_4> *)(hasBothCoordsOutOfBounds + (long)local_ec * 0x10 + -4),0.33333334
             );
    *(undefined8 *)(hasBothCoordsOutOfBounds + (long)local_ec * 0x10 + -4) = uStack_114;
    *(undefined8 *)sampleColors[local_ec].m_data = local_10c;
  }
  for (local_118 = 0; local_118 < 4; local_118 = local_118 + 1) {
    *(undefined8 *)(*dst)[local_118].m_data =
         *(undefined8 *)(hasBothCoordsOutOfBounds + (long)local_118 * 0x10 + -4);
    *(undefined8 *)((*dst)[local_118].m_data + 2) = *(undefined8 *)sampleColors[local_118].m_data;
  }
  return;
}

Assistant:

static void getCubeLinearSamples (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, float u, float v, int depth, Vec4 (&dst)[4])
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());
	int		size					= faceAccesses[0].getWidth();
	int		x0						= deFloorFloatToInt32(u-0.5f);
	int		x1						= x0+1;
	int		y0						= deFloorFloatToInt32(v-0.5f);
	int		y1						= y0+1;
	IVec2	baseSampleCoords[4]		=
	{
		IVec2(x0, y0),
		IVec2(x1, y0),
		IVec2(x0, y1),
		IVec2(x1, y1)
	};
	Vec4	sampleColors[4];
	bool	hasBothCoordsOutOfBounds[4]; //!< Whether correctCubeFace() returns CUBEFACE_LAST, i.e. both u and v are out of bounds.

	// Find correct faces and coordinates for out-of-bounds sample coordinates.

	for (int i = 0; i < 4; i++)
	{
		CubeFaceIntCoords coords = remapCubeEdgeCoords(CubeFaceIntCoords(baseFace, baseSampleCoords[i]), size);
		hasBothCoordsOutOfBounds[i] = coords.face == CUBEFACE_LAST;
		if (!hasBothCoordsOutOfBounds[i])
			sampleColors[i] = lookup(faceAccesses[coords.face], coords.s, coords.t, depth);
	}

	// If a sample was out of bounds in both u and v, we get its color from the average of the three other samples.
	// \note This averaging behavior is not required by the GLES3 spec (though it is recommended). GLES3 spec only
	//		 requires that if the three other samples all have the same color, then the doubly-out-of-bounds sample
	//		 must have this color as well.

	{
		int bothOutOfBoundsNdx = -1;
		for (int i = 0; i < 4; i++)
		{
			if (hasBothCoordsOutOfBounds[i])
			{
				DE_ASSERT(bothOutOfBoundsNdx < 0); // Only one sample can be out of bounds in both u and v.
				bothOutOfBoundsNdx = i;
			}
		}
		if (bothOutOfBoundsNdx != -1)
		{
			sampleColors[bothOutOfBoundsNdx] = Vec4(0.0f);
			for (int i = 0; i < 4; i++)
				if (i != bothOutOfBoundsNdx)
					sampleColors[bothOutOfBoundsNdx] += sampleColors[i];

			sampleColors[bothOutOfBoundsNdx] = sampleColors[bothOutOfBoundsNdx] * (1.0f/3.0f);
		}
	}

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(sampleColors); i++)
		dst[i] = sampleColors[i];
}